

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

LoadInst * __thiscall
LLVMBC::LLVMContext::construct<LLVMBC::LoadInst,LLVMBC::Type*&,LLVMBC::Value*&>
          (LLVMContext *this,Type **u,Value **u_1)

{
  LoadInst *this_00;
  
  this_00 = (LoadInst *)allocate(this,0x70,8);
  if (this_00 != (LoadInst *)0x0) {
    LoadInst::LoadInst(this_00,*u,*u_1);
    append_typed_destructor<LLVMBC::LoadInst>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}